

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_partition(uint32 part,uint32 parts)

{
  uint32 n_skip_00;
  lineiter_t *li_00;
  lineiter_t *local_28;
  lineiter_t *li;
  int lineno;
  uint32 n_skip;
  uint32 run_len;
  uint32 parts_local;
  uint32 part_local;
  
  li._0_4_ = 0;
  if (ctl_fp == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x21c,"Control file has not been set\n");
    parts_local = 0xffffffff;
  }
  else {
    for (local_28 = lineiter_start(ctl_fp); local_28 != (lineiter_t *)0x0;
        local_28 = lineiter_next(local_28)) {
      li._0_4_ = (uint)li + 1;
    }
    fseek((FILE *)ctl_fp,0,0);
    li_00 = lineiter_start(ctl_fp);
    lineiter_free(li_00);
    lineno = (uint)li / parts;
    n_skip_00 = (part - 1) * lineno;
    if (part == parts) {
      lineno = -1;
    }
    parts_local = corpus_set_interval(n_skip_00,lineno);
  }
  return parts_local;
}

Assistant:

int
corpus_set_partition(uint32 part,
		     uint32 parts)
{
    uint32 run_len;
    uint32 n_skip;
    int lineno = 0;
    lineiter_t* li;

    if (ctl_fp == NULL) {
	E_ERROR("Control file has not been set\n");

	return S3_ERROR;
    }

    for (li = lineiter_start(ctl_fp); li; li = lineiter_next(li)) {
	lineno++;
    }

    fseek(ctl_fp, 0L, SEEK_SET);
    
    li = lineiter_start(ctl_fp);
    lineiter_free(li);
    
    run_len = lineno / parts;

    n_skip = (part - 1) * run_len;

    if (part == parts)
	run_len = UNTIL_EOF;

    return corpus_set_interval(n_skip, run_len);
}